

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O0

bool __thiscall FRFFFile::Open(FRFFFile *this,bool quiet)

{
  char *copyStr;
  FileReader *pFVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  FRFFLump *pFVar6;
  ulong uVar7;
  FRFFLump *local_90;
  FString local_60;
  undefined8 local_58;
  size_t len;
  char name [13];
  DWORD i;
  undefined1 local_30 [8];
  RFFInfo header;
  RFFLump *lumps;
  bool quiet_local;
  FRFFFile *this_local;
  
  pFVar1 = (this->super_FResourceFile).Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,local_30,0x10);
  (this->super_FResourceFile).NumLumps = header.Version;
  uVar3 = SUB168(ZEXT416(header.Version) * ZEXT816(0x30),0);
  if (SUB168(ZEXT416(header.Version) * ZEXT816(0x30),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  header._8_8_ = operator_new__(uVar3);
  pFVar1 = (this->super_FResourceFile).Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(ulong)header.Magic,0);
  pFVar1 = (this->super_FResourceFile).Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])
            (pFVar1,header._8_8_,(ulong)header.Version * 0x30);
  BloodCrypt((void *)header._8_8_,header.Magic,header.Version * 0x30);
  uVar3 = CONCAT44(0,(this->super_FResourceFile).NumLumps);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0x58),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar2 * ZEXT816(0x58),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  pFVar6 = (FRFFLump *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_90 = pFVar6;
    do {
      FRFFLump::FRFFLump(local_90);
      local_90 = local_90 + 1;
    } while (local_90 != pFVar6 + uVar3);
  }
  this->Lumps = pFVar6;
  if ((!quiet) && ((batchrun & 1U) == 0)) {
    Printf(", %d lumps\n",(ulong)(this->super_FResourceFile).NumLumps);
  }
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  while( true ) {
    if ((this->super_FResourceFile).NumLumps <= (uint)name._5_4_) {
      if (header._8_8_ != 0) {
        operator_delete__((void *)header._8_8_);
      }
      return true;
    }
    *(undefined4 *)
     &this->Lumps[(uint)name._5_4_].super_FUncompressedLump.super_FResourceLump.field_0x4c =
         *(undefined4 *)(header._8_8_ + (ulong)(uint)name._5_4_ * 0x30 + 0x10);
    this->Lumps[(uint)name._5_4_].super_FUncompressedLump.super_FResourceLump.LumpSize =
         *(int *)(header._8_8_ + (ulong)(uint)name._5_4_ * 0x30 + 0x14);
    this->Lumps[(uint)name._5_4_].super_FUncompressedLump.super_FResourceLump.Owner =
         &this->super_FResourceFile;
    if ((*(byte *)(header._8_8_ + (ulong)(uint)name._5_4_ * 0x30 + 0x20) & 0x10) != 0) {
      this->Lumps[(uint)name._5_4_].super_FUncompressedLump.super_FResourceLump.Flags =
           this->Lumps[(uint)name._5_4_].super_FUncompressedLump.super_FResourceLump.Flags | 8;
    }
    this->Lumps[(uint)name._5_4_].IndexNum =
         *(DWORD *)(header._8_8_ + (ulong)(uint)name._5_4_ * 0x30 + 0x2c);
    strncpy((char *)((long)&len + 3),(char *)(header._8_8_ + (ulong)(uint)name._5_4_ * 0x30 + 0x24),
            8);
    name[0] = '\0';
    local_58 = strlen((char *)((long)&len + 3));
    if (0xc < local_58 + 4) break;
    *(undefined1 *)((long)&len + local_58 + 3) = 0x2e;
    copyStr = (char *)((long)&len + 3);
    copyStr[local_58 + 1] = *(char *)(header._8_8_ + 0x21 + (ulong)(uint)name._5_4_ * 0x30);
    copyStr[local_58 + 2] = *(char *)(header._8_8_ + 0x22 + (ulong)(uint)name._5_4_ * 0x30);
    copyStr[local_58 + 3] = *(char *)(header._8_8_ + 0x23 + (ulong)(uint)name._5_4_ * 0x30);
    copyStr[local_58 + 4] = '\0';
    pFVar6 = this->Lumps;
    uVar3 = (ulong)(uint)name._5_4_;
    FString::FString(&local_60,copyStr);
    FResourceLump::LumpNameSetup((FResourceLump *)(pFVar6 + uVar3),&local_60);
    FString::~FString(&local_60);
    if (((*(char *)((long)&len + local_58 + 4) == 'S') &&
        (*(char *)((long)&len + local_58 + 5) == 'F')) &&
       (*(char *)((long)&len + local_58 + 6) == 'X')) {
      this->Lumps[(uint)name._5_4_].super_FUncompressedLump.super_FResourceLump.Namespace = 7;
    }
    else if (((*(char *)((long)&len + local_58 + 4) == 'R') &&
             (*(char *)((long)&len + local_58 + 5) == 'A')) &&
            (*(char *)((long)&len + local_58 + 6) == 'W')) {
      this->Lumps[(uint)name._5_4_].super_FUncompressedLump.super_FResourceLump.Namespace = 6;
    }
    name._5_4_ = name._5_4_ + 1;
  }
  __assert_fail("len + 4 <= 12",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/file_rff.cpp"
                ,0xab,"virtual bool FRFFFile::Open(bool)");
}

Assistant:

bool FRFFFile::Open(bool quiet)
{
	RFFLump *lumps;
	RFFInfo header;

	Reader->Read(&header, sizeof(header));

	NumLumps = LittleLong(header.NumLumps);
	header.DirOfs = LittleLong(header.DirOfs);
	lumps = new RFFLump[header.NumLumps];
	Reader->Seek (header.DirOfs, SEEK_SET);
	Reader->Read (lumps, header.NumLumps * sizeof(RFFLump));
	BloodCrypt (lumps, header.DirOfs, header.NumLumps * sizeof(RFFLump));

	Lumps = new FRFFLump[NumLumps];

	if (!quiet && !batchrun) Printf(", %d lumps\n", NumLumps);
	for (DWORD i = 0; i < NumLumps; ++i)
	{
		Lumps[i].Position = LittleLong(lumps[i].FilePos);
		Lumps[i].LumpSize = LittleLong(lumps[i].Size);
		Lumps[i].Owner = this;
		if (lumps[i].Flags & 0x10)
		{
			Lumps[i].Flags |= LUMPF_BLOODCRYPT;
		}
		Lumps[i].IndexNum = LittleLong(lumps[i].IndexNum);
		// Rearrange the name and extension to construct the fullname.
		char name[13];
		strncpy(name, lumps[i].Name, 8);
		name[8] = 0;
		size_t len = strlen(name);
		assert(len + 4 <= 12);
		name[len+0] = '.';
		name[len+1] = lumps[i].Extension[0];
		name[len+2] = lumps[i].Extension[1];
		name[len+3] = lumps[i].Extension[2];
		name[len+4] = 0;
		Lumps[i].LumpNameSetup(name);
		if (name[len+1] == 'S' && name[len+2] == 'F' && name[len+3] == 'X')
		{
			Lumps[i].Namespace = ns_bloodsfx;
		}
		else if (name[len+1] == 'R' && name[len+2] == 'A' && name[len+3] == 'W')
		{
			Lumps[i].Namespace = ns_bloodraw;
		}
	}
	delete[] lumps;
	return true;
}